

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

void __thiscall
Saturation::SaturationAlgorithm::onClauseReduction
          (SaturationAlgorithm *this,Clause *cl,Clause **replacements,uint numOfReplacements,
          Clause *premise,bool forward)

{
  int *piVar1;
  IteratorCore<Kernel::Clause_*> *local_40;
  ClauseIterator local_38;
  
  if (premise == (Clause *)0x0) {
    ::Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
    if (local_40 != (IteratorCore<Kernel::Clause_*> *)0x0) {
      local_40->_refCnt = local_40->_refCnt + 1;
      piVar1 = &local_40->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_40->_vptr_IteratorCore[1])();
      }
    }
  }
  else {
    local_40 = (IteratorCore<Kernel::Clause_*> *)
               ::Lib::FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
    local_40->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b63388;
    *(undefined1 *)&local_40[1]._vptr_IteratorCore = 0;
    *(Clause **)&local_40[1]._refCnt = premise;
    local_40->_refCnt = 1;
  }
  if (local_40 != (IteratorCore<Kernel::Clause_*> *)0x0) {
    local_40->_refCnt = local_40->_refCnt + 1;
  }
  local_38._core = local_40;
  onClauseReduction(this,cl,replacements,numOfReplacements,&local_38,forward);
  if (local_40 != (IteratorCore<Kernel::Clause_*> *)0x0) {
    piVar1 = &local_40->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*local_40->_vptr_IteratorCore[1])(local_40);
    }
    if (local_40 != (IteratorCore<Kernel::Clause_*> *)0x0) {
      piVar1 = &local_40->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_40->_vptr_IteratorCore[1])(local_40);
      }
    }
  }
  return;
}

Assistant:

void SaturationAlgorithm::onClauseReduction(Clause* cl, Clause **replacements, unsigned numOfReplacements,
                                            Clause* premise, bool forward)
{
  ASS(cl);

  ClauseIterator premises;

  if (premise) {
    premises = pvi(getSingletonIterator(premise));
  }
  else {
    premises = ClauseIterator::getEmpty();
  }

  onClauseReduction(cl, replacements, numOfReplacements, premises, forward);
}